

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

int get8_packet_raw(vorb *f)

{
  byte bVar1;
  int iVar2;
  long in_RDI;
  vorb *in_stack_ffffffffffffffe8;
  
  if (*(char *)(in_RDI + 0x6e4) == '\0') {
    if (*(int *)(in_RDI + 0x6ec) != 0) {
      return -1;
    }
    iVar2 = next_segment(in_stack_ffffffffffffffe8);
    if (iVar2 == 0) {
      return -1;
    }
  }
  *(char *)(in_RDI + 0x6e4) = *(char *)(in_RDI + 0x6e4) + -1;
  *(int *)(in_RDI + 0x6fc) = *(int *)(in_RDI + 0x6fc) + 1;
  bVar1 = get8(in_stack_ffffffffffffffe8);
  return (uint)bVar1;
}

Assistant:

static int get8_packet_raw(vorb *f)
{
   if (!f->bytes_in_seg) {  // CLANG!
      if (f->last_seg) return EOP;
      else if (!next_segment(f)) return EOP;
   }
   assert(f->bytes_in_seg > 0);
   --f->bytes_in_seg;
   ++f->packet_bytes;
   return get8(f);
}